

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::mark_by_class(Omega_h *this,Mesh *mesh,Int ent_dim,Int class_dim,I32 class_id)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int *piVar2;
  Alloc *pAVar3;
  undefined8 uVar4;
  void *pvVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  Bytes BVar6;
  Read<signed_char> RVar7;
  Bytes id_marks;
  Read<int> e2class_id;
  Bytes local_90;
  Alloc *local_80;
  void *local_78;
  size_t local_70;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  Bytes local_40;
  
  local_80 = (Alloc *)&local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"class_id","");
  Mesh::get_array<int>((Mesh *)local_50,(Int)mesh,(string *)(ulong)(uint)ent_dim);
  if (local_80 != (Alloc *)&local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  local_60._0_8_ = local_50._0_8_;
  if ((local_50._0_8_ & 7) == 0 && (Alloc *)local_50._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60._0_8_ = *(long *)local_50._0_8_ * 8 + 1;
    }
    else {
      *(int *)(local_50._0_8_ + 0x30) = *(int *)(local_50._0_8_ + 0x30) + 1;
    }
  }
  local_60._8_8_ = local_50._8_8_;
  each_eq_to<int>((Omega_h *)&local_80,(Read<int> *)local_60,class_id);
  uVar4 = local_60._0_8_;
  if ((local_60._0_8_ & 7) == 0 && (Alloc *)local_60._0_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_60._0_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_60._0_8_);
      operator_delete((void *)uVar4,0x48);
    }
  }
  local_90.write_.shared_alloc_.alloc = local_80;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.write_.shared_alloc_.alloc = (Alloc *)(local_80->size * 8 + 1);
    }
    else {
      local_80->use_count = local_80->use_count + 1;
    }
  }
  local_90.write_.shared_alloc_.direct_ptr = local_78;
  mark_by_class_dim((Omega_h *)&local_40,mesh,ent_dim,class_dim);
  BVar6 = land_each(this,&local_90,&local_40);
  pvVar5 = BVar6.write_.shared_alloc_.direct_ptr;
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_40.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
      operator_delete(local_40.write_.shared_alloc_.alloc,0x48);
      pvVar5 = extraout_RDX;
    }
  }
  pAVar3 = local_90.write_.shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_90.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar5 = extraout_RDX_00;
    }
  }
  pAVar3 = local_80;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    piVar2 = &local_80->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_80);
      operator_delete(pAVar3,0x48);
      pvVar5 = extraout_RDX_01;
    }
  }
  if ((local_50._0_8_ & 7) == 0 && (Alloc *)local_50._0_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_50._0_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_50._0_8_);
      operator_delete((void *)local_50._0_8_,0x48);
      pvVar5 = extraout_RDX_02;
    }
  }
  RVar7.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar7.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar7.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_by_class(Mesh* mesh, Int ent_dim, Int class_dim, I32 class_id) {
  auto e2class_id = mesh->get_array<ClassId>(ent_dim, "class_id");
  auto id_marks = each_eq_to(e2class_id, class_id);
  return land_each(id_marks, mark_by_class_dim(mesh, ent_dim, class_dim));
}